

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityMarking::EntityMarking
          (EntityMarking *this,EntityMarkingCharacterSet MarkingCharSet,KString *MarkingText)

{
  KException *this_00;
  KString local_48;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityMarking_00223c58;
  this->m_ui8EntityMarkingCharacterSet = (KUINT8)MarkingCharSet;
  if (MarkingText->_M_string_length < 0xc) {
    this->m_sEntityMarkingString[8] = '\0';
    this->m_sEntityMarkingString[9] = '\0';
    this->m_sEntityMarkingString[10] = '\0';
    this->m_sEntityMarkingString[0xb] = '\0';
    this->m_sEntityMarkingString[0] = '\0';
    this->m_sEntityMarkingString[1] = '\0';
    this->m_sEntityMarkingString[2] = '\0';
    this->m_sEntityMarkingString[3] = '\0';
    this->m_sEntityMarkingString[4] = '\0';
    this->m_sEntityMarkingString[5] = '\0';
    this->m_sEntityMarkingString[6] = '\0';
    this->m_sEntityMarkingString[7] = '\0';
    SetEntityMarkingString(this,MarkingText);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EntityMarking","");
  KException::KException(this_00,&local_48,3);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

EntityMarking::EntityMarking(const EntityMarkingCharacterSet MarkingCharSet, const KString &MarkingText) noexcept(false)
        :
	m_ui8EntityMarkingCharacterSet( MarkingCharSet )
{
	if( MarkingText.size() > 11 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

	memset( m_sEntityMarkingString, 0x00, sizeof( m_sEntityMarkingString ) );
	SetEntityMarkingString( MarkingText );    
}